

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils_tests.cpp
# Opt level: O1

void __thiscall
graph_tests::gtest_suite_DsuStruct_::
DsuConstructability<graph_utils::Dsu<(anonymous_namespace)::NoDefaultConstructorComparable>_>::
~DsuConstructability
          (DsuConstructability<graph_utils::Dsu<(anonymous_namespace)::NoDefaultConstructorComparable>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST_P(DsuStruct, DsuConstructability) {
  const std::string s1 = "first";
  const std::string s2 = "second";
  const std::string s3 = "third";
  const std::string s4 = "fourth";
  const std::string su = "unknown";
  TypeParam dsu({s1, s2, s3});
  EXPECT_FALSE(dsu.Add(s1));
  EXPECT_TRUE(dsu.Add(s4));
  EXPECT_TRUE(dsu.Unite(s1, s2));
  EXPECT_FALSE(dsu.Unite(s1, s2));
  EXPECT_FALSE(dsu.Size(su));
  EXPECT_FALSE(dsu.Unite(s1, su));
  EXPECT_EQ(*dsu.Size(s1), 2);
}